

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O0

word Extra_Truth6MinimumRoundOne_noEBFC(word t,int iVar,char *pCanonPerm,uint *pCanonPhase)

{
  uint uVar1;
  word wVar2;
  word tMin;
  uint *pCanonPhase_local;
  char *pCanonPerm_local;
  int iVar_local;
  word t_local;
  
  if ((-1 < iVar) && (iVar < 5)) {
    wVar2 = Extra_Truth6SwapAdjacent(t,iVar);
    t_local = t;
    if (wVar2 <= t) {
      uVar1 = adjustInfoAfterSwap(pCanonPerm,*pCanonPhase,iVar,4);
      *pCanonPhase = uVar1;
      t_local = wVar2;
    }
    return t_local;
  }
  __assert_fail("iVar >= 0 && iVar < 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/lucky/luckyFast6.c"
                ,0xa1,"word Extra_Truth6MinimumRoundOne_noEBFC(word, int, char *, unsigned int *)");
}

Assistant:

word Extra_Truth6MinimumRoundOne_noEBFC( word t, int iVar,  char* pCanonPerm, unsigned* pCanonPhase)
{
    word tMin;     
    assert( iVar >= 0 && iVar < 5 );  
    
    tMin = Extra_Truth6SwapAdjacent( t, iVar );   // b a
    if(t<tMin)
        return t;
    else
    {
        (* pCanonPhase) = adjustInfoAfterSwap(pCanonPerm, * pCanonPhase, iVar, 4);
        return tMin;
    }
}